

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::SpecifyWithLengthCase::iterate
          (SpecifyWithLengthCase *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  bool bVar3;
  int iVar4;
  undefined4 uVar5;
  deBool dVar6;
  undefined4 extraout_var;
  undefined8 uVar8;
  NotSupportedError *this_00;
  MessageBuilder *pMVar9;
  allocator<char> local_2d5;
  int outlen;
  undefined1 local_2d0 [32];
  ScopedLogSection section;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  code *local_248;
  int local_240;
  MessageBuilder local_238;
  ResultCollector result;
  char buffer [64];
  long lVar7;
  
  bVar3 = isKHRDebugSupported((this->super_TestCase).m_context);
  if (!bVar3) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
               ,0x806);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238," // ERROR: ",(allocator<char> *)buffer);
  tcu::ResultCollector::ResultCollector(&result,pTVar2,(string *)&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  outlen = -1;
  uVar8 = (**(code **)(lVar7 + 0x640))(0x9117,0);
  iVar4 = (**(code **)(lVar7 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"Got Error ",(allocator<char> *)&section);
    local_248 = glu::getErrorName;
    local_240 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_268,&local_248);
    std::operator+(&local_288,&local_2a8,&local_268);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                   &local_288,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                   "fenceSync");
    tcu::ResultCollector::fail(&result,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)local_2d0);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_2a8);
  }
  uVar5 = (**(code **)(lVar7 + 0x3f0))(0x8b30);
  iVar4 = (**(code **)(lVar7 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"Got Error ",(allocator<char> *)&section);
    local_248 = glu::getErrorName;
    local_240 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_268,&local_248);
    std::operator+(&local_288,&local_2a8,&local_268);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                   &local_288,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                   "createShader");
    tcu::ResultCollector::fail(&result,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)local_2d0);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_2a8);
  }
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"Shader",(allocator<char> *)&local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d0,"Shader object",(allocator<char> *)&local_2a8);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)&local_238,(string *)local_2d0);
  std::__cxx11::string::~string((string *)local_2d0);
  std::__cxx11::string::~string((string *)&local_238);
  local_238.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_238.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Setting label to string: \"");
  std::operator<<((ostream *)poVar1,"This is a debug label");
  std::operator<<((ostream *)poVar1,"\" with length 12");
  tcu::MessageBuilder::operator<<(&local_238,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  (**(code **)(lVar7 + 0xfc0))(0x82e1,uVar5,0xc,"This is a debug label");
  iVar4 = (**(code **)(lVar7 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"Got Error ",&local_2d5)
    ;
    local_248 = glu::getErrorName;
    local_240 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_268,&local_248);
    std::operator+(&local_288,&local_2a8,&local_268);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                   &local_288,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                   "objectLabel");
    tcu::ResultCollector::fail(&result,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)local_2d0);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_2a8);
  }
  local_238.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_238.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Querying label");
  tcu::MessageBuilder::operator<<(&local_238,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  builtin_strncpy(buffer,"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",0x40);
  (**(code **)(lVar7 + 0x958))(0x82e1,uVar5,0x40,&outlen);
  iVar4 = (**(code **)(lVar7 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"Got Error ",&local_2d5)
    ;
    local_248 = glu::getErrorName;
    local_240 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_268,&local_248);
    std::operator+(&local_288,&local_2a8,&local_268);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                   &local_288,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                   "getObjectLabel");
    tcu::ResultCollector::fail(&result,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)local_2d0);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_2a8);
  }
  if (outlen == 0xc) {
    dVar6 = deStringEqual("This is a de",buffer);
    if (dVar6 == 0) {
      buffer._60_4_ = buffer._60_4_ & 0xffffff;
      local_238.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = &local_238.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Query returned wrong string: expected \"");
      std::operator<<((ostream *)poVar1,"This is a de");
      std::operator<<((ostream *)poVar1,"\" but got \"");
      std::operator<<((ostream *)poVar1,buffer);
      std::operator<<((ostream *)poVar1,"\"");
      tcu::MessageBuilder::operator<<(&local_238,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,"Query returned wrong label",(allocator<char> *)local_2d0);
      tcu::ResultCollector::fail(&result,(string *)&local_238);
      pMVar9 = &local_238;
      goto LAB_003d3acd;
    }
    local_238.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_238.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Query returned string: \"");
    std::operator<<((ostream *)poVar1,buffer);
    std::operator<<((ostream *)poVar1,"\"");
    tcu::MessageBuilder::operator<<(&local_238,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  else {
    de::toString<int>((string *)local_2d0,&outlen);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238,
                   "\'length\' was not 12, got ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
    tcu::ResultCollector::fail(&result,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    pMVar9 = (MessageBuilder *)local_2d0;
LAB_003d3acd:
    std::__cxx11::string::~string((string *)pMVar9);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"Sync",(allocator<char> *)&local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d0,"Sync object",(allocator<char> *)&local_2a8);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)&local_238,(string *)local_2d0);
  std::__cxx11::string::~string((string *)local_2d0);
  std::__cxx11::string::~string((string *)&local_238);
  local_238.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_238.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Setting label to string: \"");
  std::operator<<((ostream *)poVar1,"This is a debug label");
  std::operator<<((ostream *)poVar1,"\" with length 12");
  tcu::MessageBuilder::operator<<(&local_238,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  (**(code **)(lVar7 + 0xfc8))(uVar8,0xc,"This is a debug label");
  iVar4 = (**(code **)(lVar7 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"Got Error ",&local_2d5)
    ;
    local_248 = glu::getErrorName;
    local_240 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_268,&local_248);
    std::operator+(&local_288,&local_2a8,&local_268);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                   &local_288,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                   "objectPtrLabel");
    tcu::ResultCollector::fail(&result,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)local_2d0);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_2a8);
  }
  local_238.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_238.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Querying label");
  tcu::MessageBuilder::operator<<(&local_238,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  builtin_strncpy(buffer,"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",0x40);
  (**(code **)(lVar7 + 0x960))(uVar8,0x40,&outlen);
  iVar4 = (**(code **)(lVar7 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"Got Error ",&local_2d5)
    ;
    local_248 = glu::getErrorName;
    local_240 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_268,&local_248);
    std::operator+(&local_288,&local_2a8,&local_268);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                   &local_288,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                   "getObjectPtrLabel");
    tcu::ResultCollector::fail(&result,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)local_2d0);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_2a8);
  }
  if (outlen == 0xc) {
    dVar6 = deStringEqual("This is a de",buffer);
    if (dVar6 == 0) {
      buffer._60_4_ = buffer._60_4_ & 0xffffff;
      local_238.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = &local_238.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Query returned wrong string: expected \"");
      std::operator<<((ostream *)poVar1,"This is a de");
      std::operator<<((ostream *)poVar1,"\" but got \"");
      std::operator<<((ostream *)poVar1,buffer);
      std::operator<<((ostream *)poVar1,"\"");
      tcu::MessageBuilder::operator<<(&local_238,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,"Query returned wrong label",(allocator<char> *)local_2d0);
      tcu::ResultCollector::fail(&result,(string *)&local_238);
      pMVar9 = &local_238;
      goto LAB_003d3f8c;
    }
    local_238.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_238.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Query returned string: \"");
    std::operator<<((ostream *)poVar1,buffer);
    std::operator<<((ostream *)poVar1,"\"");
    tcu::MessageBuilder::operator<<(&local_238,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  else {
    de::toString<int>((string *)local_2d0,&outlen);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238,
                   "\'length\' was not 12, got ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
    tcu::ResultCollector::fail(&result,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    pMVar9 = (MessageBuilder *)local_2d0;
LAB_003d3f8c:
    std::__cxx11::string::~string((string *)pMVar9);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"ZeroSized",(allocator<char> *)&local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d0,"ZeroSized",(allocator<char> *)&local_2a8);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)&local_238,(string *)local_2d0);
  std::__cxx11::string::~string((string *)local_2d0);
  std::__cxx11::string::~string((string *)&local_238);
  local_238.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_238.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Setting label to string: \"");
  std::operator<<((ostream *)poVar1,"This is a debug label");
  std::operator<<((ostream *)poVar1,"\" with length 0");
  tcu::MessageBuilder::operator<<(&local_238,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  (**(code **)(lVar7 + 0xfc0))(0x82e1,uVar5,0,"This is a debug label");
  iVar4 = (**(code **)(lVar7 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"Got Error ",&local_2d5)
    ;
    local_248 = glu::getErrorName;
    local_240 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_268,&local_248);
    std::operator+(&local_288,&local_2a8,&local_268);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                   &local_288,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                   "objectLabel");
    tcu::ResultCollector::fail(&result,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)local_2d0);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_2a8);
  }
  local_238.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = &local_238.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Querying label");
  tcu::MessageBuilder::operator<<(&local_238,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  builtin_strncpy(buffer,"XXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXXX",0x40);
  (**(code **)(lVar7 + 0x958))(0x82e1,uVar5,0x40,&outlen);
  iVar4 = (**(code **)(lVar7 + 0x800))();
  if (iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"Got Error ",&local_2d5)
    ;
    local_248 = glu::getErrorName;
    local_240 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_268,&local_248);
    std::operator+(&local_288,&local_2a8,&local_268);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                   &local_288,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                   "getObjectLabel");
    tcu::ResultCollector::fail(&result,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)local_2d0);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_2a8);
  }
  if (outlen == 0) {
    if (buffer[0] == '\0') {
      local_238.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = &local_238.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Got 0-sized null-terminated string.");
      tcu::MessageBuilder::operator<<(&local_238,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      goto LAB_003d434d;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"label was not null terminated",(allocator<char> *)local_2d0);
    tcu::ResultCollector::fail(&result,(string *)&local_238);
    pMVar9 = &local_238;
  }
  else {
    de::toString<int>((string *)local_2d0,&outlen);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238,
                   "\'length\' was not zero, got ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
    tcu::ResultCollector::fail(&result,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    pMVar9 = (MessageBuilder *)local_2d0;
  }
  std::__cxx11::string::~string((string *)pMVar9);
LAB_003d434d:
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  (**(code **)(lVar7 + 0x470))(uVar5);
  (**(code **)(lVar7 + 0x478))(uVar8);
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  return STOP;
}

Assistant:

SpecifyWithLengthCase::IterateResult SpecifyWithLengthCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	const char*	const		msg			= "This is a debug label";
	const char*	const		clipMsg		= "This is a de";
	int						outlen		= -1;
	GLuint					shader;
	glw::GLsync				sync;
	char					buffer[64];

	sync = gl.fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "fenceSync");

	shader = gl.createShader(GL_FRAGMENT_SHADER);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "createShader");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Shader", "Shader object");

		m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\" with length 12" << TestLog::EndMessage;
		gl.objectLabel(GL_SHADER, shader, 12, msg);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectLabel");

		m_testCtx.getLog() << TestLog::Message << "Querying label" << TestLog::EndMessage;
		deMemset(buffer, 'X', sizeof(buffer));
		gl.getObjectLabel(GL_SHADER, shader, sizeof(buffer), &outlen, buffer);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

		if (outlen != 12)
			result.fail("'length' was not 12, got " + de::toString(outlen));
		else if (deStringEqual(clipMsg, buffer))
		{
			m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		}
		else
		{
			buffer[63] = '\0'; // make sure buffer is null terminated before printing
			m_testCtx.getLog() << TestLog::Message << "Query returned wrong string: expected \"" << clipMsg << "\" but got \"" << buffer << "\"" << TestLog::EndMessage;
			result.fail("Query returned wrong label");
		}
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Sync", "Sync object");

		m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\" with length 12" << TestLog::EndMessage;
		gl.objectPtrLabel(sync, 12, msg);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectPtrLabel");

		m_testCtx.getLog() << TestLog::Message << "Querying label" << TestLog::EndMessage;
		deMemset(buffer, 'X', sizeof(buffer));
		gl.getObjectPtrLabel(sync, sizeof(buffer), &outlen, buffer);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

		if (outlen != 12)
			result.fail("'length' was not 12, got " + de::toString(outlen));
		else if (deStringEqual(clipMsg, buffer))
		{
			m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		}
		else
		{
			buffer[63] = '\0'; // make sure buffer is null terminated before printing
			m_testCtx.getLog() << TestLog::Message << "Query returned wrong string: expected \"" << clipMsg << "\" but got \"" << buffer << "\"" << TestLog::EndMessage;
			result.fail("Query returned wrong label");
		}
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "ZeroSized", "ZeroSized");

		m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\" with length 0" << TestLog::EndMessage;
		gl.objectLabel(GL_SHADER, shader, 0, msg);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectLabel");

		m_testCtx.getLog() << TestLog::Message << "Querying label" << TestLog::EndMessage;
		deMemset(buffer, 'X', sizeof(buffer));
		gl.getObjectLabel(GL_SHADER, shader, sizeof(buffer), &outlen, buffer);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

		if (outlen != 0)
			result.fail("'length' was not zero, got " + de::toString(outlen));
		else if (buffer[0] != '\0')
			result.fail("label was not null terminated");
		else
			m_testCtx.getLog() << TestLog::Message << "Got 0-sized null-terminated string." << TestLog::EndMessage;
	}

	gl.deleteShader(shader);
	gl.deleteSync(sync);

	result.setTestContextResult(m_testCtx);
	return STOP;
}